

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffgr8b(fitsfile *fptr,LONGLONG byteloc,long nvals,long incre,double *values,int *status)

{
  long in_RCX;
  fitsfile *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  double *in_R9;
  LONGLONG postemp;
  fitsfile *in_stack_00000038;
  long in_stack_ffffffffffffffc8;
  int err_mode;
  
  err_mode = (int)((ulong)in_R8 >> 0x20);
  if (in_RCX == 8) {
    if ((long)in_RDX * 8 < 0x21c0) {
      ffmbyt(in_RDX,8,err_mode,(int *)in_R9);
      ffgbyt((fitsfile *)byteloc,nvals,(void *)incre,(int *)values);
    }
    else {
      in_stack_ffffffffffffffc8 = *(long *)(*(long *)(in_RDI + 8) + 0x40);
      *(undefined8 *)(*(long *)(in_RDI + 8) + 0x40) = in_RSI;
      ffgbyt((fitsfile *)byteloc,nvals,(void *)incre,(int *)values);
      *(long *)(*(long *)(in_RDI + 8) + 0x40) = in_stack_ffffffffffffffc8;
    }
  }
  else {
    ffmbyt(in_RDX,in_RCX,err_mode,(int *)in_R9);
    ffgbytoff(in_stack_00000038,(long)fptr,byteloc,nvals,(void *)incre,(int *)values);
  }
  ffswap8(in_R9,in_stack_ffffffffffffffc8);
  return *(int *)in_R9;
}

Assistant:

int ffgr8b(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG byteloc,   /* I - position within file to start reading    */
           long nvals,      /* I - number of pixels to read                 */
           long incre,      /* I - byte increment between pixels            */
           double *values,  /* O - returned array of values                 */
           int *status)     /* IO - error status                            */
/*
  get (read) the array of values from the FITS file, doing machine dependent
  format conversion (e.g. byte-swapping) if necessary.
*/
{
    LONGLONG  postemp;

#if MACHINE == VAXVMS
    long ii;

#elif (MACHINE == ALPHAVMS) && (FLOATTYPE == GFLOAT)
    short *sptr;
    long ii;

#endif

    if (incre == 8)      /* read all the values at once (contiguous bytes) */
    {
        if (nvals * 8 < MINDIRECT)  /* read normally via IO buffers */
        {
           ffmbyt(fptr, byteloc, REPORT_EOF, status);
           ffgbyt(fptr, nvals * 8, values, status);
        }
        else            /* read directly from disk, bypassing IO buffers */
        {
           postemp = (fptr->Fptr)->bytepos;   /* store current file position */
           (fptr->Fptr)->bytepos = byteloc;   /* set to the desired position */
           ffgbyt(fptr, nvals * 8, values, status);
           (fptr->Fptr)->bytepos = postemp;   /* reset to original position */
        }
    }
    else         /* have to read each value individually (not contiguous ) */
    {
        ffmbyt(fptr, byteloc, REPORT_EOF, status);
        ffgbytoff(fptr, 8, nvals, incre - 8, values, status);
    }

#if MACHINE == VAXVMS
    ii = nvals;                      /* call VAX macro routine to convert */
    ieevud(values, values, &ii);     /* from  IEEE float -> D float       */

#elif (MACHINE == ALPHAVMS) && (FLOATTYPE == GFLOAT)
    ffswap2( (short *) values, nvals * 4);  /* swap pairs of bytes */

    /* convert from IEEE float format to VMS GFLOAT float format */
    sptr = (short *) values;
    for (ii = 0; ii < nvals; ii++, sptr += 4)
    {
        if (!dnan(*sptr) )  /* test for NaN or underflow */
            values[ii] *= 4.0;
    }

#elif BYTESWAPPED
    ffswap8(values, nvals);   /* reverse order of bytes in each value */
#endif

    return(*status);
}